

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

mat4 * __thiscall graphics101::Mesh::normalizingTransformation(Mesh *this)

{
  mat4 *in_RDI;
  
  in_RDI->value[0].field_0.x = 1.0;
  in_RDI->value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  in_RDI->value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  *(undefined8 *)&in_RDI->value[0].field_3 = 0;
  in_RDI->value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f800000;
  in_RDI->value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  *(undefined8 *)&in_RDI->value[1].field_3 = 0;
  in_RDI->value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  in_RDI->value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  *(undefined8 *)&in_RDI->value[2].field_3 = 0;
  in_RDI->value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  in_RDI->value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  in_RDI->value[3].field_3.w = 1.0;
  return in_RDI;
}

Assistant:

mat4 Mesh::normalizingTransformation() const {
    // Your code goes here.
    
    // If there are no positions, return the identity.
    if( positions.empty() ) {
        return mat4(1.0);
    }
    
    // The identity matrix.
    // Replace this with your implementation.
    return mat4(1.0);
}